

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageSizeTests.cpp
# Opt level: O3

long __thiscall
glcts::anon_unknown_0::AdvancedNonMS<tcu::Vector<unsigned_int,_4>,_5>::Run
          (AdvancedNonMS<tcu::Vector<unsigned_int,_4>,_5> *this)

{
  CallLogWrapper *this_00;
  GLenum target;
  bool bVar1;
  int i;
  long lVar2;
  GLenum *pGVar3;
  ImageSizeMachine machine;
  undefined1 *puStack_78;
  int aiStack_70 [16];
  
  bVar1 = ShaderImageSizeBase::IsVSFSAvailable(&this->super_ShaderImageSizeBase,0,4);
  lVar2 = 0x10;
  if (bVar1) {
    this_00 = &(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    pGVar3 = &DAT_01b13d20;
    lVar2 = 0;
    do {
      target = *pGVar3;
      glu::CallLogWrapper::glBindTexture(this_00,target,this->m_texture[lVar2]);
      glu::CallLogWrapper::glTexParameteri(this_00,target,0x2801,0x2600);
      glu::CallLogWrapper::glTexParameteri(this_00,target,0x2800,0x2600);
      glu::CallLogWrapper::glTexStorage3D(this_00,target,2,0x8d70,2,2,7);
      glu::CallLogWrapper::glBindImageTexture
                (this_00,0,this->m_texture[lVar2],1,'\0',3,35000,0x8d70);
      lVar2 = lVar2 + 1;
      pGVar3 = pGVar3 + 1;
    } while (lVar2 != 4);
    ImageSizeMachine::ImageSizeMachine(&machine);
    puStack_78 = &DAT_100000001;
    aiStack_70[0] = 0;
    aiStack_70[1] = 0;
    aiStack_70[2] = 2;
    aiStack_70[3] = 2;
    aiStack_70[4] = 1;
    aiStack_70[5] = 0;
    aiStack_70[6] = 2;
    aiStack_70[7] = 2;
    aiStack_70[8] = 0;
    aiStack_70[9] = 0;
    aiStack_70[10] = 6;
    aiStack_70[0xb] = 3;
    aiStack_70[0xc] = 4;
    aiStack_70[0xd] = 0;
    lVar2 = glcts::(anonymous_namespace)::ImageSizeMachine::Run<tcu::Vector<unsigned_int,4>>
                      ((ImageSizeMachine *)&machine,5,(ivec4 *)&puStack_78);
    ImageSizeMachine::~ImageSizeMachine(&machine);
  }
  return lVar2;
}

Assistant:

virtual long Run()
	{
		if (STAGE == 0 && !IsVSFSAvailable(4, 0))
			return NOT_SUPPORTED;
		if (STAGE == 5 && !IsVSFSAvailable(0, 4))
			return NOT_SUPPORTED;

		const GLenum target[4] = { GL_TEXTURE_2D_ARRAY, GL_TEXTURE_3D, GL_TEXTURE_CUBE_MAP, GL_TEXTURE_2D_ARRAY };
		for (int i = 0; i < 4; ++i)
		{
			glBindTexture(target[i], m_texture[i]);
			glTexParameteri(target[i], GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(target[i], GL_TEXTURE_MAG_FILTER, GL_NEAREST);

			if (i == 0)
			{
				glTexStorage3D(target[i], 2, TexInternalFormat<T>(), 2, 2, 7);
				glBindImageTexture(0, m_texture[i], 1, GL_FALSE, 3, GL_READ_ONLY, TexInternalFormat<T>());
			}
			else if (i == 1)
			{
				glTexStorage3D(target[i], 3, TexInternalFormat<T>(), 4, 4, 2);
				glBindImageTexture(1, m_texture[i], 1, GL_TRUE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
			else if (i == 2)
			{
				glTexStorage2D(target[i], 2, TexInternalFormat<T>(), 2, 2);
				glBindImageTexture(2, m_texture[i], 0, GL_TRUE, 0, GL_READ_WRITE, TexInternalFormat<T>());
			}
			else if (i == 3)
			{
				glTexStorage3D(target[i], 4, TexInternalFormat<T>(), 13, 7, 4);
				glBindImageTexture(3, m_texture[i], 1, GL_TRUE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
		}
		ImageSizeMachine machine;
		ivec4			 res[4] = { ivec4(1, 1, 0, 0), ivec4(2, 2, 1, 0), ivec4(2, 2, 0, 0), ivec4(6, 3, 4, 0) };
		return machine.Run<T>(STAGE, res);
	}